

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O1

bool __thiscall Controller::loadGraphic(Controller *this,QImage *image)

{
  unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_> *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ImageProvider *pIVar4;
  pointer __p;
  __uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_> local_38;
  
  pIVar4 = (ImageProvider *)operator_new(0x30);
  ImageProvider::ImageProvider(pIVar4);
  this_00 = &this->imageProvider;
  local_38._M_t.super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
  super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl =
       (tuple<ImageProvider_*,_std::default_delete<ImageProvider>_>)
       (_Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>)0x0;
  std::__uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>::reset
            ((__uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_> *)this_00,pIVar4);
  std::unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_>::~unique_ptr
            ((unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_> *)&local_38);
  pIVar4 = (this->imageProvider)._M_t.
           super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
           super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
           super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl;
  uVar3 = Options::getTileSize();
  ImageProvider::prepareGraphicBoard(pIVar4,image,(ulong)uVar3);
  bVar1 = ImageProvider::isGraphicBoard
                    ((this->imageProvider)._M_t.
                     super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
                     super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
                     super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl,FOUR);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = ImageProvider::isGraphicBoard
                      ((this_00->_M_t).
                       super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
                       super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl,FIVE);
    if (!bVar1) {
      bVar1 = ImageProvider::isGraphicBoard
                        ((this_00->_M_t).
                         super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>
                         .super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl,SIX);
      if (!bVar1) {
        bVar2 = ImageProvider::isGraphicBoard
                          ((this_00->_M_t).
                           super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>
                           .super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl,SEVEN);
      }
    }
  }
  return bVar2;
}

Assistant:

bool Controller::loadGraphic( QImage& image )
{
    imageProvider = std::make_unique<ImageProvider>();
    imageProvider->prepareGraphicBoard( image, Options::getTileSize() );

    return imageProvider->isGraphicBoard( BoardSize::FOUR ) || imageProvider->isGraphicBoard( BoardSize::FIVE ) ||
           imageProvider->isGraphicBoard( BoardSize::SIX )  || imageProvider->isGraphicBoard( BoardSize::SEVEN );
}